

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<LargeBlock<32,_2048>_*,_false,_false>::reset
          (FastVector<LargeBlock<32,_2048>_*,_false,_false> *this)

{
  FastVector<LargeBlock<32,_2048>_*,_false,_false> *this_local;
  
  if (this->data != (LargeBlock<32,_2048> **)0x0) {
    NULLC::destruct<LargeBlock<32,2048>*>(this->data,(ulong)this->max);
  }
  this->data = (LargeBlock<32,_2048> **)0x0;
  this->max = 0;
  this->count = 0;
  return;
}

Assistant:

void reset()
	{
		if(data)
		{
			if(!skipConstructor)
				NULLC::destruct(data, max);
			else
				NULLC::alignedDealloc(data);
		}

		data = 0;
		max = 0;
		count = 0;
	}